

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

bool r_exec::e10(Context *context,uint16_t *index)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  Atom *a;
  float fVar6;
  double dVar7;
  Atom local_30 [4];
  Atom local_2c [4];
  long *plVar4;
  
  iVar3 = (*context->implementation->_vptr__Context[7])(context->implementation,1);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  plVar5 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
  (**(code **)(*plVar4 + 8))(plVar4);
  (**(code **)(*plVar5 + 0x20))(plVar5,0);
  cVar1 = r_code::Atom::isFloat();
  if (cVar1 == '\0') {
    a = local_30;
    r_code::Atom::Nil();
    uVar2 = Context::setAtomicResult(context,a);
  }
  else {
    (**(code **)(*plVar5 + 0x20))(plVar5,0);
    fVar6 = (float)r_code::Atom::asFloat();
    dVar7 = pow(10.0,(double)fVar6);
    a = local_2c;
    r_code::Atom::Float((float)dVar7);
    uVar2 = Context::setAtomicResult(context,a);
  }
  *index = uVar2;
  r_code::Atom::~Atom(a);
  (**(code **)(*plVar5 + 8))(plVar5);
  return (bool)cVar1;
}

Assistant:

bool e10(const Context &context, uint16_t &index)
{
    Context arg = *context.getChild(1);

    if (arg[0].isFloat()) {
        index = context.setAtomicResult(Atom::Float(pow(10, arg[0].asFloat())));
        return true;
    }

    index = context.setAtomicResult(Atom::Nil());
    return false;
}